

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

const_iterator
deqp::gles2::Functional::UniformCase::BasicUniformReportGL::findWithName
          (vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
           *vec,char *name)

{
  bool bVar1;
  pointer __lhs;
  const_iterator cVar2;
  __normal_iterator<const_deqp::gles2::Functional::UniformCase::BasicUniformReportGL_*,_std::vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>_>
  local_28;
  char *local_20;
  char *name_local;
  vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
  *vec_local;
  const_iterator it;
  
  local_20 = name;
  name_local = (char *)vec;
  vec_local = (vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
               *)std::
                 vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
                 ::begin(vec);
  while( true ) {
    local_28._M_current =
         (BasicUniformReportGL *)
         std::
         vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
         ::end((vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
                *)name_local);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_deqp::gles2::Functional::UniformCase::BasicUniformReportGL_*,_std::vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>_>
                        *)&vec_local,&local_28);
    if (!bVar1) {
      cVar2 = std::
              vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
              ::end((vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>
                     *)name_local);
      return (const_iterator)cVar2._M_current;
    }
    __lhs = __gnu_cxx::
            __normal_iterator<const_deqp::gles2::Functional::UniformCase::BasicUniformReportGL_*,_std::vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>_>
            ::operator->((__normal_iterator<const_deqp::gles2::Functional::UniformCase::BasicUniformReportGL_*,_std::vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>_>
                          *)&vec_local);
    bVar1 = std::operator==(&__lhs->name,local_20);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_deqp::gles2::Functional::UniformCase::BasicUniformReportGL_*,_std::vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>_>
    ::operator++((__normal_iterator<const_deqp::gles2::Functional::UniformCase::BasicUniformReportGL_*,_std::vector<deqp::gles2::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportGL>_>_>
                  *)&vec_local,0);
  }
  return (const_iterator)(BasicUniformReportGL *)vec_local;
}

Assistant:

static vector<BasicUniformReportGL>::const_iterator findWithName (const vector<BasicUniformReportGL>& vec, const char* const name)
		{
			for (vector<BasicUniformReportGL>::const_iterator it = vec.begin(); it != vec.end(); it++)
			{
				if (it->name == name)
					return it;
			}
			return vec.end();
		}